

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

void __thiscall
Color::Color(Color *this,color_id fg,color_id bg,bool underline,bool bold,bool bright)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bright_local;
  bool bold_local;
  bool underline_local;
  color_id bg_local;
  color_id fg_local;
  Color *this_local;
  
  this->_value = 0;
  uVar1 = 0;
  if (underline) {
    uVar1 = 0x4000000;
  }
  uVar2 = 0;
  if (bold) {
    uVar2 = 0x2000000;
  }
  uVar3 = 0;
  if (bright) {
    uVar3 = 0x1000000;
  }
  this->_value = (long)(int)(uVar1 | uVar2 | uVar3) | this->_value;
  if (bg != nocolor) {
    this->_value = this->_value | 0x10000000;
    this->_value = (long)(int)(bg << 8) | this->_value;
  }
  if (fg != nocolor) {
    this->_value = this->_value | 0x8000000;
    this->_value = (ulong)fg | this->_value;
  }
  return;
}

Assistant:

Color::Color (color_id fg, color_id bg, bool underline, bool bold, bool bright)
: _value (0)
{
  _value |= ((underline ? _COLOR_UNDERLINE : 0))
         |  ((bold      ? _COLOR_BOLD : 0))
         |  ((bright    ? _COLOR_BRIGHT : 0));

  if (bg != Color::nocolor)
  {
    _value |= _COLOR_HASBG;
    _value |= (bg << 8);
  }

  if (fg != Color::nocolor)
  {
    _value |= _COLOR_HASFG;
    _value |= fg;
  }
}